

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxFunctionSignature.cpp
# Opt level: O0

String * __thiscall
Jinx::Impl::FunctionSignature::GetName_abi_cxx11_
          (String *__return_storage_ptr__,FunctionSignature *this)

{
  bool bVar1;
  bool bVar2;
  pointer pFVar3;
  reference __str;
  size_type sVar4;
  char *__s;
  __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
  local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
  local_58;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
  local_50;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
  local_48;
  const_iterator nameItr;
  __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
  local_38;
  const_iterator partItr;
  FunctionSignature *this_local;
  String *fnName;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (__return_storage_ptr__);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::reserve
            (__return_storage_ptr__,0x20);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::empty
                    (&this->m_libraryName);
  if (!bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              (__return_storage_ptr__,&this->m_libraryName);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
              (__return_storage_ptr__," ");
  }
  local_38._M_current =
       (FunctionSignaturePart *)
       std::
       vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
       ::begin(&this->m_parts);
  while( true ) {
    nameItr._M_current =
         (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::end(&this->m_parts);
    bVar1 = __gnu_cxx::operator!=
                      (&local_38,
                       (__normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                        *)&nameItr);
    if (!bVar1) break;
    pFVar3 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
             ::operator->(&local_38);
    if (pFVar3->partType == Name) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
               ::operator->(&local_38);
      if ((pFVar3->optional & 1U) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__,"(");
      }
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
               ::operator->(&local_38);
      local_48._M_current =
           (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
           ::begin(&pFVar3->names);
      while( true ) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                 ::operator->(&local_38);
        local_50._M_current =
             (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ::end(&pFVar3->names);
        bVar1 = __gnu_cxx::operator!=(&local_48,&local_50);
        if (!bVar1) break;
        __str = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
                ::operator*(&local_48);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__,__str);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>_>
        ::operator++(&local_48);
        pFVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                 ::operator->(&local_38);
        local_58._M_current =
             (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
             ::end(&pFVar3->names);
        bVar2 = __gnu_cxx::operator!=(&local_48,&local_58);
        bVar1 = false;
        if (bVar2) {
          pFVar3 = __gnu_cxx::
                   __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                   ::operator->(&local_38);
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                  ::size(&pFVar3->names);
          bVar1 = 1 < sVar4;
        }
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          operator+=(__return_storage_ptr__,"/");
        }
      }
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
               ::operator->(&local_38);
      if ((pFVar3->optional & 1U) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__,")");
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                (__return_storage_ptr__,"{");
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
               ::operator->(&local_38);
      if (pFVar3->valueType != Any) {
        pFVar3 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
                 ::operator->(&local_38);
        __s = GetValueTypeName(pFVar3->valueType);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                  (__return_storage_ptr__,__s);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                (__return_storage_ptr__,"}");
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::FunctionSignaturePart_*,_std::vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>_>
    ::operator++(&local_38);
    local_60._M_current =
         (FunctionSignaturePart *)
         std::
         vector<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
         ::end(&this->m_parts);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_60);
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::operator+=
                (__return_storage_ptr__," ");
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t String FunctionSignature::GetName() const
	{
		String fnName;
		fnName.reserve(32);
		if (!m_libraryName.empty())
		{
			fnName += m_libraryName;
			fnName += " ";
		}
		for (auto partItr = m_parts.begin(); partItr != m_parts.end();)
		{
			if (partItr->partType == FunctionSignaturePartType::Name)
			{
				if (partItr->optional)
					fnName += "(";
				for (auto nameItr = partItr->names.begin(); nameItr != partItr->names.end();)
				{
					fnName += *nameItr;
					++nameItr;
					if (nameItr != partItr->names.end() && partItr->names.size() > 1)
						fnName += "/";
				}
				if (partItr->optional)
					fnName += ")";
			}
			else
			{
				fnName += "{";
				if (partItr->valueType != ValueType::Any)
					fnName += GetValueTypeName(partItr->valueType);
				fnName += "}";
			}

			++partItr;
			if (partItr != m_parts.end())
				fnName += " ";
		}
		return fnName;
	}